

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::_lookup_path_or_create(Tree *this,csubstr path,size_t start)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  csubstr cVar4;
  lookup_result r;
  lookup_result local_48;
  
  if (start == 0xffffffffffffffff) {
    start = root_id(this);
  }
  local_48.target = 0xffffffffffffffff;
  local_48.path_pos = 0;
  local_48.closest = start;
  local_48.path.str = path.str;
  local_48.path.len = path.len;
  _lookup_path(this,&local_48);
  sVar3 = local_48.target;
  if (local_48.target == 0xffffffffffffffff) {
    _lookup_path_modify(this,&local_48);
    sVar3 = local_48.target;
  }
  else {
    cVar4 = lookup_result::unresolved(&local_48);
    if (cVar4.str != (char *)0x0 && cVar4.len != 0) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          sVar3 = (*pcVar1)();
          return sVar3;
        }
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x68de,"r.unresolved().empty()");
    }
  }
  return sVar3;
}

Assistant:

size_t Tree::_lookup_path_or_create(csubstr path, size_t start)
{
    if(start == NONE)
        start = root_id();
    lookup_result r(path, start);
    _lookup_path(&r);
    if(r.target != NONE)
    {
        C4_ASSERT(r.unresolved().empty());
        return r.target;
    }
    _lookup_path_modify(&r);
    return r.target;
}